

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O3

int LzmaDec_DecodeReal2(CLzmaDec *p,SizeT limit,Byte *bufLimit)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  UInt16 *pUVar4;
  Byte *pBVar5;
  SizeT SVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  UInt16 *pUVar16;
  SizeT SVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  UInt32 UVar22;
  long lVar23;
  Byte *pBVar24;
  short sVar25;
  UInt32 UVar26;
  byte bVar27;
  uint uVar28;
  uint uVar29;
  UInt32 UVar30;
  ushort *puVar31;
  uint uVar32;
  UInt32 mask;
  uint uVar33;
  ulong uVar34;
  byte *pbVar35;
  ulong uVar36;
  uint local_cc;
  UInt32 local_c8;
  UInt32 local_c4;
  UInt32 local_a0;
  ulong local_88;
  
  uVar34 = p->dicPos;
  do {
    UVar30 = p->processedPos;
    uVar15 = p->checkDicSize;
    local_88 = limit;
    if ((uVar15 == 0) &&
       (uVar36 = (ulong)((p->prop).dicSize - UVar30), local_88 = uVar34 + uVar36,
       limit - uVar34 <= uVar36)) {
      local_88 = limit;
    }
    pUVar4 = p->probs;
    uVar36 = (ulong)p->state;
    local_cc = p->reps[0];
    local_c4 = p->reps[1];
    local_c8 = p->reps[2];
    uVar7 = (p->prop).pb;
    local_a0 = p->reps[3];
    uVar8 = (p->prop).lp;
    pBVar5 = p->dic;
    SVar6 = p->dicBufSize;
    pbVar35 = p->buf;
    uVar21 = p->range;
    uVar9 = p->code;
    bVar2 = (byte)(p->prop).lc;
    uVar32 = 0;
LAB_005d1525:
    UVar26 = local_a0;
    uVar28 = local_cc;
    if (uVar21 < 0x1000000) {
      uVar21 = uVar21 << 8;
      bVar27 = *pbVar35;
      pbVar35 = pbVar35 + 1;
      uVar9 = (uint)bVar27 | uVar9 << 8;
    }
    uVar10 = UVar30 & ~(-1 << ((byte)uVar7 & 0x1f));
    uVar11 = (ulong)uVar10;
    uVar29 = (uint)uVar36;
    uVar12 = (ulong)(uVar29 << 4);
    uVar3 = pUVar4[uVar12 + uVar11];
    uVar19 = (uVar21 >> 0xb) * (uint)uVar3;
    uVar13 = uVar9 - uVar19;
    if (uVar9 < uVar19) {
      pUVar4[uVar12 + uVar11] = (short)(0x800 - uVar3 >> 5) + uVar3;
      pUVar16 = pUVar4 + 0x736;
      if (UVar30 != 0 || uVar15 != 0) {
        uVar36 = uVar34;
        if (uVar34 == 0) {
          uVar36 = SVar6;
        }
        pUVar16 = pUVar4 + 0x736 +
                  ((uint)(pBVar5[uVar36 - 1] >> (8 - bVar2 & 0x1f)) +
                  ((UVar30 & ~(-1 << ((byte)uVar8 & 0x1f))) << (bVar2 & 0x1f))) * 0x300;
      }
      if (uVar29 < 7) {
        uVar21 = uVar29 - 3;
        if (uVar29 < 3) {
          uVar21 = 0;
        }
        uVar36 = (ulong)uVar21;
        if (uVar19 < 0x1000000) {
          uVar19 = uVar19 * 0x100;
          bVar27 = *pbVar35;
          pbVar35 = pbVar35 + 1;
          uVar9 = (uint)bVar27 | uVar9 << 8;
        }
        uVar3 = pUVar16[1];
        uVar28 = (uVar19 >> 0xb) * (uint)uVar3;
        uVar21 = uVar9 - uVar28;
        if (uVar9 < uVar28) {
          sVar25 = (short)(0x800 - uVar3 >> 5);
          uVar29 = 2;
          uVar21 = uVar9;
        }
        else {
          uVar28 = uVar19 - uVar28;
          sVar25 = -(uVar3 >> 5);
          uVar29 = 3;
        }
        pUVar16[1] = sVar25 + uVar3;
        if (uVar28 < 0x1000000) {
          uVar28 = uVar28 << 8;
          bVar27 = *pbVar35;
          pbVar35 = pbVar35 + 1;
          uVar21 = (uint)bVar27 | uVar21 << 8;
        }
        uVar3 = pUVar16[uVar29];
        uVar10 = (uVar28 >> 0xb) * (uint)uVar3;
        uVar9 = uVar29 * 2;
        uVar13 = uVar21 - uVar10;
        if (uVar21 < uVar10) {
          sVar25 = (short)(0x800 - uVar3 >> 5);
          uVar13 = uVar21;
        }
        else {
          uVar10 = uVar28 - uVar10;
          sVar25 = -(uVar3 >> 5);
          uVar9 = uVar9 | 1;
        }
        pUVar16[uVar29] = sVar25 + uVar3;
        uVar3 = pUVar16[uVar9];
        if (uVar10 < 0x1000000) {
          uVar10 = uVar10 << 8;
          bVar27 = *pbVar35;
          pbVar35 = pbVar35 + 1;
          uVar13 = (uint)bVar27 | uVar13 << 8;
        }
        uVar29 = (uVar10 >> 0xb) * (uint)uVar3;
        uVar21 = uVar9 * 2;
        uVar28 = uVar13 - uVar29;
        if (uVar13 < uVar29) {
          sVar25 = (short)(0x800 - uVar3 >> 5);
          uVar28 = uVar13;
        }
        else {
          uVar29 = uVar10 - uVar29;
          sVar25 = -(uVar3 >> 5);
          uVar21 = uVar21 | 1;
        }
        pUVar16[uVar9] = sVar25 + uVar3;
        uVar3 = pUVar16[uVar21];
        if (uVar29 < 0x1000000) {
          uVar29 = uVar29 << 8;
          bVar27 = *pbVar35;
          pbVar35 = pbVar35 + 1;
          uVar28 = (uint)bVar27 | uVar28 << 8;
        }
        uVar10 = (uVar29 >> 0xb) * (uint)uVar3;
        uVar9 = uVar21 * 2;
        uVar13 = uVar28 - uVar10;
        if (uVar28 < uVar10) {
          sVar25 = (short)(0x800 - uVar3 >> 5);
          uVar13 = uVar28;
        }
        else {
          uVar10 = uVar29 - uVar10;
          sVar25 = -(uVar3 >> 5);
          uVar9 = uVar9 | 1;
        }
        pUVar16[uVar21] = sVar25 + uVar3;
        uVar3 = pUVar16[uVar9];
        if (uVar10 < 0x1000000) {
          uVar10 = uVar10 << 8;
          bVar27 = *pbVar35;
          pbVar35 = pbVar35 + 1;
          uVar13 = (uint)bVar27 | uVar13 << 8;
        }
        uVar29 = (uVar10 >> 0xb) * (uint)uVar3;
        uVar21 = uVar9 * 2;
        uVar28 = uVar13 - uVar29;
        if (uVar13 < uVar29) {
          sVar25 = (short)(0x800 - uVar3 >> 5);
          uVar28 = uVar13;
        }
        else {
          uVar29 = uVar10 - uVar29;
          sVar25 = -(uVar3 >> 5);
          uVar21 = uVar21 | 1;
        }
        pUVar16[uVar9] = sVar25 + uVar3;
        uVar3 = pUVar16[uVar21];
        if (uVar29 < 0x1000000) {
          uVar29 = uVar29 << 8;
          bVar27 = *pbVar35;
          pbVar35 = pbVar35 + 1;
          uVar28 = (uint)bVar27 | uVar28 << 8;
        }
        uVar10 = (uVar29 >> 0xb) * (uint)uVar3;
        uVar9 = uVar21 * 2;
        uVar13 = uVar28 - uVar10;
        if (uVar28 < uVar10) {
          sVar25 = (short)(0x800 - uVar3 >> 5);
          uVar13 = uVar28;
        }
        else {
          uVar10 = uVar29 - uVar10;
          sVar25 = -(uVar3 >> 5);
          uVar9 = uVar9 | 1;
        }
        pUVar16[uVar21] = sVar25 + uVar3;
        uVar3 = pUVar16[uVar9];
        if (uVar10 < 0x1000000) {
          uVar10 = uVar10 << 8;
          bVar27 = *pbVar35;
          pbVar35 = pbVar35 + 1;
          uVar13 = (uint)bVar27 | uVar13 << 8;
        }
        uVar19 = (uVar10 >> 0xb) * (uint)uVar3;
        uVar28 = uVar9 * 2;
        uVar29 = uVar13 - uVar19;
        if (uVar13 < uVar19) {
          sVar25 = (short)(0x800 - uVar3 >> 5);
          uVar29 = uVar13;
        }
        else {
          uVar19 = uVar10 - uVar19;
          sVar25 = -(uVar3 >> 5);
          uVar28 = uVar28 | 1;
        }
        pUVar16[uVar9] = sVar25 + uVar3;
        uVar3 = pUVar16[uVar28];
        if (uVar19 < 0x1000000) {
          uVar19 = uVar19 << 8;
          bVar27 = *pbVar35;
          pbVar35 = pbVar35 + 1;
          uVar29 = (uint)bVar27 | uVar29 << 8;
        }
        uVar21 = (uVar19 >> 0xb) * (uint)uVar3;
        bVar27 = (char)uVar28 * '\x02';
        uVar9 = uVar29 - uVar21;
        if (uVar29 < uVar21) {
          pUVar16[uVar28] = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar9 = uVar29;
        }
        else {
          uVar21 = uVar19 - uVar21;
          pUVar16[uVar28] = uVar3 - (uVar3 >> 5);
          bVar27 = bVar27 | 1;
        }
      }
      else {
        SVar17 = 0;
        if (uVar34 < local_cc) {
          SVar17 = SVar6;
        }
        if (uVar19 < 0x1000000) {
          uVar19 = uVar19 * 0x100;
          bVar27 = *pbVar35;
          pbVar35 = pbVar35 + 1;
          uVar9 = (uint)bVar27 | uVar9 << 8;
        }
        bVar27 = pBVar5[SVar17 + (uVar34 - local_cc)];
        uVar10 = (uint)bVar27;
        uVar13 = (uint)bVar27 + (uint)bVar27 & 0x100;
        uVar36 = (ulong)uVar13;
        uVar3 = pUVar16[uVar36 + 0x101];
        uVar28 = (uVar19 >> 0xb) * (uint)uVar3;
        uVar21 = uVar9 - uVar28;
        if (uVar9 < uVar28) {
          sVar25 = (short)(0x800 - uVar3 >> 5);
          uVar13 = uVar13 ^ 0x100;
          uVar19 = 2;
          uVar11 = (ulong)uVar13;
          uVar21 = uVar9;
        }
        else {
          uVar28 = uVar19 - uVar28;
          sVar25 = -(uVar3 >> 5);
          uVar19 = 3;
          uVar11 = uVar36;
        }
        pUVar16[uVar36 + 0x101] = sVar25 + uVar3;
        if (uVar28 < 0x1000000) {
          uVar28 = uVar28 << 8;
          bVar1 = *pbVar35;
          pbVar35 = pbVar35 + 1;
          uVar21 = (uint)bVar1 | uVar21 << 8;
        }
        uVar20 = (uint)bVar27 * 4 & uVar13;
        uVar36 = (ulong)uVar20;
        uVar3 = pUVar16[uVar11 + uVar36 + uVar19];
        uVar33 = (uVar28 >> 0xb) * (uint)uVar3;
        uVar9 = uVar19 * 2;
        uVar18 = uVar21 - uVar33;
        if (uVar21 < uVar33) {
          sVar25 = (short)(0x800 - uVar3 >> 5);
          uVar12 = (ulong)(uVar20 ^ uVar13);
          uVar18 = uVar21;
        }
        else {
          uVar33 = uVar28 - uVar33;
          sVar25 = -(uVar3 >> 5);
          uVar9 = uVar9 | 1;
          uVar12 = uVar36;
        }
        pUVar16[uVar11 + uVar36 + uVar19] = sVar25 + uVar3;
        uVar21 = (uint)bVar27 * 8 & (uint)uVar12;
        uVar36 = (ulong)uVar21;
        uVar3 = pUVar16[uVar12 + uVar36 + uVar9];
        if (uVar33 < 0x1000000) {
          uVar33 = uVar33 << 8;
          bVar1 = *pbVar35;
          pbVar35 = pbVar35 + 1;
          uVar18 = (uint)bVar1 | uVar18 << 8;
        }
        uVar19 = (uVar33 >> 0xb) * (uint)uVar3;
        uVar28 = uVar9 * 2;
        uVar13 = uVar18 - uVar19;
        if (uVar18 < uVar19) {
          sVar25 = (short)(0x800 - uVar3 >> 5);
          uVar11 = (ulong)(uVar21 ^ (uint)uVar12);
          uVar13 = uVar18;
        }
        else {
          uVar19 = uVar33 - uVar19;
          sVar25 = -(uVar3 >> 5);
          uVar28 = uVar28 | 1;
          uVar11 = uVar36;
        }
        pUVar16[uVar12 + uVar36 + uVar9] = sVar25 + uVar3;
        uVar21 = uVar10 << 4 & (uint)uVar11;
        uVar36 = (ulong)uVar21;
        uVar3 = pUVar16[uVar11 + uVar36 + uVar28];
        if (uVar19 < 0x1000000) {
          uVar19 = uVar19 << 8;
          bVar1 = *pbVar35;
          pbVar35 = pbVar35 + 1;
          uVar13 = (uint)bVar1 | uVar13 << 8;
        }
        uVar33 = (uVar19 >> 0xb) * (uint)uVar3;
        uVar9 = uVar28 * 2;
        uVar18 = uVar13 - uVar33;
        if (uVar13 < uVar33) {
          sVar25 = (short)(0x800 - uVar3 >> 5);
          uVar12 = (ulong)(uVar21 ^ (uint)uVar11);
          uVar18 = uVar13;
        }
        else {
          uVar33 = uVar19 - uVar33;
          sVar25 = -(uVar3 >> 5);
          uVar9 = uVar9 | 1;
          uVar12 = uVar36;
        }
        pUVar16[uVar11 + uVar36 + uVar28] = sVar25 + uVar3;
        uVar21 = (uint)bVar27 << 5 & (uint)uVar12;
        uVar36 = (ulong)uVar21;
        uVar3 = pUVar16[uVar12 + uVar36 + uVar9];
        if (uVar33 < 0x1000000) {
          uVar33 = uVar33 << 8;
          bVar27 = *pbVar35;
          pbVar35 = pbVar35 + 1;
          uVar18 = (uint)bVar27 | uVar18 << 8;
        }
        uVar19 = (uVar33 >> 0xb) * (uint)uVar3;
        uVar28 = uVar9 * 2;
        uVar13 = uVar18 - uVar19;
        if (uVar18 < uVar19) {
          sVar25 = (short)(0x800 - uVar3 >> 5);
          uVar11 = (ulong)(uVar21 ^ (uint)uVar12);
          uVar13 = uVar18;
        }
        else {
          uVar19 = uVar33 - uVar19;
          sVar25 = -(uVar3 >> 5);
          uVar28 = uVar28 | 1;
          uVar11 = uVar36;
        }
        pUVar16[uVar12 + uVar36 + uVar9] = sVar25 + uVar3;
        uVar21 = uVar10 << 6 & (uint)uVar11;
        uVar36 = (ulong)uVar21;
        uVar3 = pUVar16[uVar11 + uVar36 + uVar28];
        if (uVar19 < 0x1000000) {
          uVar19 = uVar19 << 8;
          bVar27 = *pbVar35;
          pbVar35 = pbVar35 + 1;
          uVar13 = (uint)bVar27 | uVar13 << 8;
        }
        uVar33 = (uVar19 >> 0xb) * (uint)uVar3;
        uVar9 = uVar28 * 2;
        uVar18 = uVar13 - uVar33;
        if (uVar13 < uVar33) {
          sVar25 = (short)(0x800 - uVar3 >> 5);
          uVar12 = (ulong)(uVar21 ^ (uint)uVar11);
          uVar18 = uVar13;
        }
        else {
          uVar33 = uVar19 - uVar33;
          sVar25 = -(uVar3 >> 5);
          uVar9 = uVar9 | 1;
          uVar12 = uVar36;
        }
        pUVar16[uVar11 + uVar36 + uVar28] = sVar25 + uVar3;
        uVar21 = uVar10 << 7 & (uint)uVar12;
        uVar36 = (ulong)uVar21;
        uVar3 = pUVar16[uVar12 + uVar36 + uVar9];
        if (uVar33 < 0x1000000) {
          uVar33 = uVar33 << 8;
          bVar27 = *pbVar35;
          pbVar35 = pbVar35 + 1;
          uVar18 = (uint)bVar27 | uVar18 << 8;
        }
        uVar19 = (uVar33 >> 0xb) * (uint)uVar3;
        uVar28 = uVar9 * 2;
        uVar13 = uVar18 - uVar19;
        if (uVar18 < uVar19) {
          sVar25 = (short)(0x800 - uVar3 >> 5);
          uVar11 = (ulong)(uVar21 ^ (uint)uVar12);
          uVar13 = uVar18;
        }
        else {
          uVar19 = uVar33 - uVar19;
          sVar25 = -(uVar3 >> 5);
          uVar28 = uVar28 | 1;
          uVar11 = uVar36;
        }
        pUVar16[uVar12 + uVar36 + uVar9] = sVar25 + uVar3;
        lVar23 = (ulong)(uVar10 << 9 & (int)uVar11 * 2) + uVar11 * 2;
        uVar11 = (ulong)uVar28;
        uVar3 = *(ushort *)((long)pUVar16 + uVar11 * 2 + lVar23);
        if (uVar19 < 0x1000000) {
          uVar19 = uVar19 << 8;
          bVar27 = *pbVar35;
          pbVar35 = pbVar35 + 1;
          uVar13 = (uint)bVar27 | uVar13 << 8;
        }
        uVar36 = (ulong)((uVar29 + (uint)(uVar29 < 10) * 3) - 6);
        uVar21 = (uVar19 >> 0xb) * (uint)uVar3;
        bVar27 = (char)uVar28 * '\x02';
        uVar9 = uVar13 - uVar21;
        if (uVar13 < uVar21) {
          *(ushort *)((long)pUVar16 + uVar11 * 2 + lVar23) = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar9 = uVar13;
        }
        else {
          uVar21 = uVar19 - uVar21;
          *(ushort *)((long)pUVar16 + uVar11 * 2 + lVar23) = uVar3 - (uVar3 >> 5);
          bVar27 = bVar27 | 1;
        }
      }
      pBVar5[uVar34] = bVar27;
      uVar34 = uVar34 + 1;
      uVar11 = 1;
      goto LAB_005d2b2c;
    }
    uVar21 = uVar21 - uVar19;
    pUVar4[uVar12 + uVar11] = uVar3 - (uVar3 >> 5);
    if (uVar21 < 0x1000000) {
      uVar21 = uVar21 * 0x100;
      bVar27 = *pbVar35;
      pbVar35 = pbVar35 + 1;
      uVar13 = uVar13 * 0x100 | (uint)bVar27;
    }
    uVar3 = pUVar4[uVar36 + 0xc0];
    uVar19 = (uVar21 >> 0xb) * (uint)uVar3;
    uVar9 = uVar13 - uVar19;
    UVar22 = local_c8;
    if (uVar13 < uVar19) {
      pUVar4[uVar36 + 0xc0] = (short)(0x800 - uVar3 >> 5) + uVar3;
      uVar29 = uVar29 + 0xc;
      puVar31 = pUVar4 + 0x332;
    }
    else {
      pUVar4[uVar36 + 0xc0] = uVar3 - (uVar3 >> 5);
      if (UVar30 == 0 && uVar15 == 0) {
        return 1;
      }
      uVar21 = uVar21 - uVar19;
      if (uVar21 < 0x1000000) {
        uVar21 = uVar21 * 0x100;
        bVar27 = *pbVar35;
        pbVar35 = pbVar35 + 1;
        uVar9 = (uint)bVar27 | uVar9 * 0x100;
      }
      uVar3 = pUVar4[uVar36 + 0xcc];
      uVar19 = (uVar21 >> 0xb) * (uint)uVar3;
      uVar13 = uVar9 - uVar19;
      if (uVar9 < uVar19) {
        pUVar4[uVar36 + 0xcc] = (short)(0x800 - uVar3 >> 5) + uVar3;
        if (uVar19 < 0x1000000) {
          uVar19 = uVar19 * 0x100;
          bVar27 = *pbVar35;
          pbVar35 = pbVar35 + 1;
          uVar9 = (uint)bVar27 | uVar9 << 8;
        }
        uVar3 = pUVar4[uVar12 + uVar11 + 0xf0];
        uVar21 = (uVar19 >> 0xb) * (uint)uVar3;
        uVar13 = uVar9 - uVar21;
        if (uVar9 < uVar21) {
          pUVar4[uVar12 + uVar11 + 0xf0] = (short)(0x800 - uVar3 >> 5) + uVar3;
          SVar17 = 0;
          if (uVar34 < local_cc) {
            SVar17 = SVar6;
          }
          pBVar5[uVar34] = pBVar5[SVar17 + (uVar34 - local_cc)];
          uVar34 = uVar34 + 1;
          uVar36 = (ulong)((uint)(6 < uVar29) * 2 + 9);
          uVar11 = 1;
          goto LAB_005d2b2c;
        }
        uVar19 = uVar19 - uVar21;
        pUVar4[uVar12 + uVar11 + 0xf0] = uVar3 - (uVar3 >> 5);
        uVar28 = local_c4;
      }
      else {
        uVar21 = uVar21 - uVar19;
        pUVar4[uVar36 + 0xcc] = uVar3 - (uVar3 >> 5);
        if (uVar21 < 0x1000000) {
          uVar21 = uVar21 * 0x100;
          bVar27 = *pbVar35;
          pbVar35 = pbVar35 + 1;
          uVar13 = uVar13 * 0x100 | (uint)bVar27;
        }
        uVar3 = pUVar4[uVar36 + 0xd8];
        uVar19 = (uVar21 >> 0xb) * (uint)uVar3;
        uVar9 = uVar13 - uVar19;
        if (uVar13 < uVar19) {
          pUVar4[uVar36 + 0xd8] = (short)(0x800 - uVar3 >> 5) + uVar3;
          local_cc = local_c4;
        }
        else {
          uVar21 = uVar21 - uVar19;
          pUVar4[uVar36 + 0xd8] = uVar3 - (uVar3 >> 5);
          if (uVar21 < 0x1000000) {
            uVar21 = uVar21 * 0x100;
            bVar27 = *pbVar35;
            pbVar35 = pbVar35 + 1;
            uVar9 = uVar9 * 0x100 | (uint)bVar27;
          }
          uVar3 = pUVar4[uVar36 + 0xe4];
          uVar19 = (uVar21 >> 0xb) * (uint)uVar3;
          uVar13 = uVar9 - uVar19;
          if (uVar9 < uVar19) {
            sVar25 = (short)(0x800 - uVar3 >> 5);
            uVar13 = uVar9;
            UVar26 = local_c8;
          }
          else {
            uVar19 = uVar21 - uVar19;
            sVar25 = -(uVar3 >> 5);
            local_a0 = local_c8;
          }
          pUVar4[uVar36 + 0xe4] = sVar25 + uVar3;
          UVar22 = local_c4;
          local_cc = UVar26;
        }
      }
      uVar29 = (uint)(6 < uVar29) * 3 + 8;
      puVar31 = pUVar4 + 0x534;
      local_c4 = uVar28;
    }
    uVar36 = (ulong)uVar29;
    uVar3 = *puVar31;
    if (uVar19 < 0x1000000) {
      uVar19 = uVar19 << 8;
      bVar27 = *pbVar35;
      pbVar35 = pbVar35 + 1;
      uVar13 = uVar13 << 8 | (uint)bVar27;
    }
    uVar21 = (uVar19 >> 0xb) * (uint)uVar3;
    uVar32 = uVar13 - uVar21;
    if (uVar13 < uVar21) {
      *puVar31 = (short)(0x800 - uVar3 >> 5) + uVar3;
      if (uVar21 < 0x1000000) {
        uVar21 = uVar21 * 0x100;
        bVar27 = *pbVar35;
        pbVar35 = pbVar35 + 1;
        uVar13 = uVar13 << 8 | (uint)bVar27;
      }
      uVar11 = (ulong)(uVar10 << 3);
      uVar3 = puVar31[uVar11 + 3];
      uVar32 = (uVar21 >> 0xb) * (uint)uVar3;
      uVar9 = uVar13 - uVar32;
      if (uVar13 < uVar32) {
        sVar25 = (short)(0x800 - uVar3 >> 5);
        uVar21 = 2;
        uVar9 = uVar13;
      }
      else {
        uVar32 = uVar21 - uVar32;
        sVar25 = -(uVar3 >> 5);
        uVar21 = 3;
      }
      puVar31[uVar11 + 3] = sVar25 + uVar3;
      if (uVar32 < 0x1000000) {
        uVar32 = uVar32 << 8;
        bVar27 = *pbVar35;
        pbVar35 = pbVar35 + 1;
        uVar9 = uVar9 << 8 | (uint)bVar27;
      }
      uVar3 = puVar31[uVar11 + (ulong)uVar21 + 2];
      uVar10 = (uVar32 >> 0xb) * (uint)uVar3;
      uVar28 = uVar21 * 2;
      uVar13 = uVar9 - uVar10;
      if (uVar9 < uVar10) {
        sVar25 = (short)(0x800 - uVar3 >> 5);
        uVar13 = uVar9;
      }
      else {
        uVar10 = uVar32 - uVar10;
        sVar25 = -(uVar3 >> 5);
        uVar28 = uVar28 | 1;
      }
      puVar31[uVar11 + (ulong)uVar21 + 2] = sVar25 + uVar3;
      uVar3 = puVar31[uVar11 + (ulong)uVar28 + 2];
      if (uVar10 < 0x1000000) {
        uVar10 = uVar10 << 8;
        bVar27 = *pbVar35;
        pbVar35 = pbVar35 + 1;
        uVar13 = uVar13 << 8 | (uint)bVar27;
      }
      uVar21 = (uVar10 >> 0xb) * (uint)uVar3;
      uVar32 = uVar28 * 2;
      uVar9 = uVar13 - uVar21;
      if (uVar13 < uVar21) {
        sVar25 = (short)(0x800 - uVar3 >> 5);
        uVar9 = uVar13;
      }
      else {
        uVar21 = uVar10 - uVar21;
        sVar25 = -(uVar3 >> 5);
        uVar32 = uVar32 | 1;
      }
      puVar31[uVar11 + (ulong)uVar28 + 2] = sVar25 + uVar3;
      uVar32 = uVar32 - 8;
    }
    else {
      uVar19 = uVar19 - uVar21;
      *puVar31 = uVar3 - (uVar3 >> 5);
      if (uVar19 < 0x1000000) {
        uVar19 = uVar19 * 0x100;
        bVar27 = *pbVar35;
        pbVar35 = pbVar35 + 1;
        uVar32 = uVar32 * 0x100 | (uint)bVar27;
      }
      uVar3 = puVar31[1];
      uVar21 = (uVar19 >> 0xb) * (uint)uVar3;
      uVar9 = uVar32 - uVar21;
      if (uVar32 < uVar21) {
        puVar31[1] = (short)(0x800 - uVar3 >> 5) + uVar3;
        if (uVar21 < 0x1000000) {
          uVar21 = uVar21 * 0x100;
          bVar27 = *pbVar35;
          pbVar35 = pbVar35 + 1;
          uVar32 = uVar32 << 8 | (uint)bVar27;
        }
        uVar11 = (ulong)(uVar10 << 3);
        uVar3 = puVar31[uVar11 + 0x83];
        uVar28 = (uVar21 >> 0xb) * (uint)uVar3;
        uVar9 = uVar32 - uVar28;
        if (uVar32 < uVar28) {
          sVar25 = (short)(0x800 - uVar3 >> 5);
          uVar21 = 2;
          uVar9 = uVar32;
        }
        else {
          uVar28 = uVar21 - uVar28;
          sVar25 = -(uVar3 >> 5);
          uVar21 = 3;
        }
        puVar31[uVar11 + 0x83] = sVar25 + uVar3;
        if (uVar28 < 0x1000000) {
          uVar28 = uVar28 << 8;
          bVar27 = *pbVar35;
          pbVar35 = pbVar35 + 1;
          uVar9 = uVar9 << 8 | (uint)bVar27;
        }
        uVar3 = puVar31[uVar11 + (ulong)uVar21 + 0x82];
        uVar10 = (uVar28 >> 0xb) * (uint)uVar3;
        uVar32 = uVar21 * 2;
        uVar13 = uVar9 - uVar10;
        if (uVar9 < uVar10) {
          sVar25 = (short)(0x800 - uVar3 >> 5);
          uVar13 = uVar9;
        }
        else {
          uVar10 = uVar28 - uVar10;
          sVar25 = -(uVar3 >> 5);
          uVar32 = uVar32 | 1;
        }
        puVar31[uVar11 + (ulong)uVar21 + 0x82] = sVar25 + uVar3;
        uVar12 = (ulong)uVar32;
        uVar3 = puVar31[uVar11 + uVar12 + 0x82];
        if (uVar10 < 0x1000000) {
          uVar10 = uVar10 << 8;
          bVar27 = *pbVar35;
          pbVar35 = pbVar35 + 1;
          uVar13 = (uint)bVar27 | uVar13 << 8;
        }
        uVar21 = (uVar10 >> 0xb) * (uint)uVar3;
        uVar32 = uVar32 * 2;
        uVar9 = uVar13 - uVar21;
        if (uVar13 < uVar21) {
          puVar31[uVar11 + uVar12 + 0x82] = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar9 = uVar13;
        }
        else {
          uVar21 = uVar10 - uVar21;
          puVar31[uVar11 + uVar12 + 0x82] = uVar3 - (uVar3 >> 5);
          uVar32 = uVar32 | 1;
        }
      }
      else {
        uVar21 = uVar19 - uVar21;
        puVar31[1] = uVar3 - (uVar3 >> 5);
        uVar11 = 1;
        do {
          uVar28 = uVar21;
          uVar13 = uVar9;
          if (uVar21 < 0x1000000) {
            uVar28 = uVar21 << 8;
            bVar27 = *pbVar35;
            pbVar35 = pbVar35 + 1;
            uVar13 = uVar9 << 8 | (uint)bVar27;
          }
          uVar3 = puVar31[uVar11 + 0x102];
          uVar21 = (uVar28 >> 0xb) * (uint)uVar3;
          uVar32 = (int)uVar11 * 2;
          uVar9 = uVar13 - uVar21;
          if (uVar13 < uVar21) {
            sVar25 = (short)(0x800 - uVar3 >> 5);
            uVar9 = uVar13;
          }
          else {
            uVar21 = uVar28 - uVar21;
            sVar25 = -(uVar3 >> 5);
            uVar32 = uVar32 | 1;
          }
          puVar31[uVar11 + 0x102] = sVar25 + uVar3;
          uVar11 = (ulong)uVar32;
        } while (uVar32 < 0x100);
        uVar32 = uVar32 - 0xf0;
      }
    }
    local_c8 = UVar22;
    if (uVar29 < 0xc) {
LAB_005d2aac:
      uVar12 = local_88 - uVar34;
      if (uVar12 == 0) {
        p->dicPos = local_88;
        return 1;
      }
      uVar32 = uVar32 + 2;
      uVar11 = uVar12 & 0xffffffff;
      if (uVar32 <= uVar12) {
        uVar11 = (ulong)uVar32;
      }
      SVar17 = 0;
      if (uVar34 < local_cc) {
        SVar17 = SVar6;
      }
      SVar17 = SVar17 + (uVar34 - local_cc);
      uVar32 = uVar32 - (int)uVar11;
      if (SVar6 - SVar17 < uVar11) {
        lVar23 = 0;
        do {
          pBVar5[lVar23 + uVar34] = pBVar5[SVar17];
          SVar17 = SVar17 + 1;
          if (SVar17 == SVar6) {
            SVar17 = 0;
          }
          lVar23 = lVar23 + 1;
        } while ((int)uVar11 != (int)lVar23);
        uVar34 = uVar34 + lVar23;
      }
      else {
        pBVar24 = pBVar5 + uVar34;
        uVar12 = uVar11;
        do {
          *pBVar24 = pBVar24[SVar17 - uVar34];
          pBVar24 = pBVar24 + 1;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
        uVar34 = uVar34 + uVar11;
      }
LAB_005d2b2c:
      UVar30 = UVar30 + (int)uVar11;
      if ((local_88 <= uVar34) || (bufLimit <= pbVar35)) goto LAB_005d2b41;
      goto LAB_005d1525;
    }
    uVar28 = 3;
    if (uVar32 < 3) {
      uVar28 = uVar32;
    }
    if (uVar21 < 0x1000000) {
      uVar21 = uVar21 << 8;
      bVar27 = *pbVar35;
      pbVar35 = pbVar35 + 1;
      uVar9 = (uint)bVar27 | uVar9 << 8;
    }
    uVar36 = (ulong)(uVar28 << 7);
    uVar3 = *(ushort *)((long)pUVar4 + uVar36 + 0x362);
    uVar13 = (uVar21 >> 0xb) * (uint)uVar3;
    uVar28 = uVar9 - uVar13;
    if (uVar9 < uVar13) {
      sVar25 = (short)(0x800 - uVar3 >> 5);
      uVar21 = 2;
      uVar28 = uVar9;
    }
    else {
      uVar13 = uVar21 - uVar13;
      sVar25 = -(uVar3 >> 5);
      uVar21 = 3;
    }
    lVar23 = uVar36 + 0x360;
    *(ushort *)((long)pUVar4 + uVar36 + 0x362) = sVar25 + uVar3;
    if (uVar13 < 0x1000000) {
      uVar13 = uVar13 << 8;
      bVar27 = *pbVar35;
      pbVar35 = pbVar35 + 1;
      uVar28 = (uint)bVar27 | uVar28 << 8;
    }
    uVar3 = *(ushort *)((long)pUVar4 + (ulong)uVar21 * 2 + lVar23);
    uVar19 = (uVar13 >> 0xb) * (uint)uVar3;
    uVar9 = uVar21 * 2;
    uVar10 = uVar28 - uVar19;
    if (uVar28 < uVar19) {
      sVar25 = (short)(0x800 - uVar3 >> 5);
      uVar10 = uVar28;
    }
    else {
      uVar19 = uVar13 - uVar19;
      sVar25 = -(uVar3 >> 5);
      uVar9 = uVar9 | 1;
    }
    *(ushort *)((long)pUVar4 + (ulong)uVar21 * 2 + lVar23) = sVar25 + uVar3;
    uVar3 = *(ushort *)((long)pUVar4 + (ulong)uVar9 * 2 + lVar23);
    if (uVar19 < 0x1000000) {
      uVar19 = uVar19 << 8;
      bVar27 = *pbVar35;
      pbVar35 = pbVar35 + 1;
      uVar10 = (uint)bVar27 | uVar10 << 8;
    }
    uVar13 = (uVar19 >> 0xb) * (uint)uVar3;
    uVar21 = uVar9 * 2;
    uVar28 = uVar10 - uVar13;
    if (uVar10 < uVar13) {
      sVar25 = (short)(0x800 - uVar3 >> 5);
      uVar28 = uVar10;
    }
    else {
      uVar13 = uVar19 - uVar13;
      sVar25 = -(uVar3 >> 5);
      uVar21 = uVar21 | 1;
    }
    *(ushort *)((long)pUVar4 + (ulong)uVar9 * 2 + lVar23) = sVar25 + uVar3;
    uVar3 = *(ushort *)((long)pUVar4 + (ulong)uVar21 * 2 + lVar23);
    if (uVar13 < 0x1000000) {
      uVar13 = uVar13 << 8;
      bVar27 = *pbVar35;
      pbVar35 = pbVar35 + 1;
      uVar28 = (uint)bVar27 | uVar28 << 8;
    }
    uVar19 = (uVar13 >> 0xb) * (uint)uVar3;
    uVar9 = uVar21 * 2;
    uVar10 = uVar28 - uVar19;
    if (uVar28 < uVar19) {
      sVar25 = (short)(0x800 - uVar3 >> 5);
      uVar10 = uVar28;
    }
    else {
      uVar19 = uVar13 - uVar19;
      sVar25 = -(uVar3 >> 5);
      uVar9 = uVar9 | 1;
    }
    *(ushort *)((long)pUVar4 + (ulong)uVar21 * 2 + lVar23) = sVar25 + uVar3;
    uVar3 = *(ushort *)((long)pUVar4 + (ulong)uVar9 * 2 + lVar23);
    if (uVar19 < 0x1000000) {
      uVar19 = uVar19 << 8;
      bVar27 = *pbVar35;
      pbVar35 = pbVar35 + 1;
      uVar10 = (uint)bVar27 | uVar10 << 8;
    }
    uVar18 = (uVar19 >> 0xb) * (uint)uVar3;
    uVar28 = uVar9 * 2;
    uVar13 = uVar10 - uVar18;
    if (uVar10 < uVar18) {
      sVar25 = (short)(0x800 - uVar3 >> 5);
      uVar13 = uVar10;
    }
    else {
      uVar18 = uVar19 - uVar18;
      sVar25 = -(uVar3 >> 5);
      uVar28 = uVar28 | 1;
    }
    *(ushort *)((long)pUVar4 + (ulong)uVar9 * 2 + lVar23) = sVar25 + uVar3;
    uVar3 = *(ushort *)((long)pUVar4 + (ulong)uVar28 * 2 + lVar23);
    if (uVar18 < 0x1000000) {
      uVar18 = uVar18 << 8;
      bVar27 = *pbVar35;
      pbVar35 = pbVar35 + 1;
      uVar13 = (uint)bVar27 | uVar13 << 8;
    }
    uVar21 = (uVar18 >> 0xb) * (uint)uVar3;
    uVar10 = uVar28 * 2;
    uVar9 = uVar13 - uVar21;
    if (uVar13 < uVar21) {
      sVar25 = (short)(0x800 - uVar3 >> 5);
      uVar9 = uVar13;
    }
    else {
      uVar21 = uVar18 - uVar21;
      sVar25 = -(uVar3 >> 5);
      uVar10 = uVar10 | 1;
    }
    *(ushort *)((long)pUVar4 + (ulong)uVar28 * 2 + lVar23) = sVar25 + uVar3;
    uVar28 = uVar10 - 0x40;
    if (uVar28 < 4) {
LAB_005d2a4e:
      uVar13 = UVar30;
      if (uVar15 != 0) {
        uVar13 = uVar15;
      }
      if (uVar13 <= uVar28) {
        p->dicPos = uVar34;
        return 1;
      }
      uVar36 = (ulong)(0x12 < uVar29) * 3 + 7;
      local_c8 = local_c4;
      local_c4 = local_cc;
      local_cc = uVar28 + 1;
      local_a0 = UVar22;
      goto LAB_005d2aac;
    }
    uVar13 = uVar10 & 1 | 2;
    if (uVar28 < 0xe) {
      iVar14 = (uVar28 >> 1) - 1;
      uVar13 = uVar13 << ((byte)iVar14 & 0x1f);
      uVar36 = (ulong)uVar28;
      uVar10 = 1;
      uVar19 = 1;
      uVar28 = uVar13;
      do {
        uVar18 = uVar21;
        if (uVar21 < 0x1000000) {
          uVar18 = uVar21 << 8;
          bVar27 = *pbVar35;
          pbVar35 = pbVar35 + 1;
          uVar9 = uVar9 << 8 | (uint)bVar27;
        }
        uVar11 = (ulong)uVar19;
        uVar3 = pUVar4[(ulong)uVar13 + ((uVar11 + 0x2af) - uVar36)];
        uVar21 = (uVar18 >> 0xb) * (uint)uVar3;
        uVar19 = uVar19 * 2;
        uVar33 = uVar9 - uVar21;
        if (uVar9 < uVar21) {
          sVar25 = (short)(0x800 - uVar3 >> 5);
        }
        else {
          uVar21 = uVar18 - uVar21;
          sVar25 = -(uVar3 >> 5);
          uVar19 = uVar19 | 1;
          uVar28 = uVar28 | uVar10;
          uVar9 = uVar33;
        }
        pUVar4[(ulong)uVar13 + ((uVar11 + 0x2af) - uVar36)] = sVar25 + uVar3;
        uVar10 = uVar10 * 2;
        iVar14 = iVar14 + -1;
      } while (iVar14 != 0);
      goto LAB_005d2a4e;
    }
    iVar14 = (uVar28 >> 1) - 5;
    do {
      uVar28 = uVar21;
      if (uVar21 < 0x1000000) {
        bVar27 = *pbVar35;
        pbVar35 = pbVar35 + 1;
        uVar9 = (uint)bVar27 | uVar9 << 8;
        uVar28 = uVar21 << 8;
      }
      uVar21 = uVar28 >> 1;
      uVar10 = (int)(uVar9 - uVar21) >> 0x1f;
      uVar13 = uVar10 + uVar13 * 2 + 1;
      uVar9 = (uVar10 & uVar21) + (uVar9 - uVar21);
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
    if (uVar28 < 0x2000000) {
      uVar21 = uVar21 << 8;
      bVar27 = *pbVar35;
      pbVar35 = pbVar35 + 1;
      uVar9 = (uint)bVar27 | uVar9 * 0x100;
    }
    uVar28 = uVar13 * 0x10;
    uVar3 = pUVar4[0x323];
    uVar10 = (uVar21 >> 0xb) * (uint)uVar3;
    uVar13 = uVar9 - uVar10;
    if (uVar9 < uVar10) {
      sVar25 = (short)(0x800 - uVar3 >> 5);
      uVar21 = 2;
      uVar13 = uVar9;
    }
    else {
      uVar10 = uVar21 - uVar10;
      sVar25 = -(uVar3 >> 5);
      uVar28 = uVar28 | 1;
      uVar21 = 3;
    }
    pUVar4[0x323] = sVar25 + uVar3;
    if (uVar10 < 0x1000000) {
      uVar10 = uVar10 << 8;
      bVar27 = *pbVar35;
      pbVar35 = pbVar35 + 1;
      uVar13 = (uint)bVar27 | uVar13 << 8;
    }
    uVar3 = pUVar4[(ulong)uVar21 + 0x322];
    uVar18 = (uVar10 >> 0xb) * (uint)uVar3;
    uVar9 = uVar21 * 2;
    uVar19 = uVar13 - uVar18;
    if (uVar13 < uVar18) {
      sVar25 = (short)(0x800 - uVar3 >> 5);
      uVar19 = uVar13;
    }
    else {
      uVar18 = uVar10 - uVar18;
      sVar25 = -(uVar3 >> 5);
      uVar9 = uVar9 | 1;
      uVar28 = uVar28 | 2;
    }
    pUVar4[(ulong)uVar21 + 0x322] = sVar25 + uVar3;
    uVar3 = pUVar4[(ulong)uVar9 + 0x322];
    if (uVar18 < 0x1000000) {
      uVar18 = uVar18 << 8;
      bVar27 = *pbVar35;
      pbVar35 = pbVar35 + 1;
      uVar19 = (uint)bVar27 | uVar19 << 8;
    }
    uVar33 = (uVar18 >> 0xb) * (uint)uVar3;
    uVar13 = uVar9 * 2;
    uVar10 = uVar19 - uVar33;
    if (uVar19 < uVar33) {
      sVar25 = (short)(0x800 - uVar3 >> 5);
      uVar10 = uVar19;
    }
    else {
      uVar33 = uVar18 - uVar33;
      sVar25 = -(uVar3 >> 5);
      uVar13 = uVar13 | 1;
      uVar28 = uVar28 | 4;
    }
    pUVar4[(ulong)uVar9 + 0x322] = sVar25 + uVar3;
    uVar3 = pUVar4[(ulong)uVar13 + 0x322];
    if (uVar33 < 0x1000000) {
      uVar33 = uVar33 << 8;
      bVar27 = *pbVar35;
      pbVar35 = pbVar35 + 1;
      uVar10 = (uint)bVar27 | uVar10 << 8;
    }
    uVar21 = (uVar33 >> 0xb) * (uint)uVar3;
    uVar9 = uVar10 - uVar21;
    if (uVar10 < uVar21) {
      sVar25 = (short)(0x800 - uVar3 >> 5);
      uVar9 = uVar10;
    }
    else {
      uVar21 = uVar33 - uVar21;
      sVar25 = -(uVar3 >> 5);
      uVar28 = uVar28 | 8;
    }
    pUVar4[(ulong)uVar13 + 0x322] = sVar25 + uVar3;
    if (uVar28 != 0xffffffff) goto LAB_005d2a4e;
    uVar32 = uVar32 + 0x112;
    uVar36 = (ulong)(uVar29 - 0xc);
LAB_005d2b41:
    if (uVar21 < 0x1000000) {
      uVar21 = uVar21 << 8;
      bVar2 = *pbVar35;
      pbVar35 = pbVar35 + 1;
      uVar9 = (uint)bVar2 | uVar9 << 8;
    }
    p->buf = pbVar35;
    p->range = uVar21;
    p->code = uVar9;
    p->remainLen = uVar32;
    p->dicPos = uVar34;
    p->processedPos = UVar30;
    p->reps[0] = local_cc;
    p->reps[1] = local_c4;
    p->reps[2] = local_c8;
    p->reps[3] = local_a0;
    p->state = (uint)uVar36;
    if ((p->checkDicSize == 0) && (uVar15 = (p->prop).dicSize, uVar15 <= UVar30)) {
      p->checkDicSize = uVar15;
    }
    LzmaDec_WriteRem(p,limit);
    uVar34 = p->dicPos;
    if (limit <= uVar34) {
      uVar15 = p->remainLen;
LAB_005d2c2d:
      if (0x112 < uVar15) {
        p->remainLen = 0x112;
      }
      return 0;
    }
    uVar15 = p->remainLen;
    if ((bufLimit <= p->buf) || (0x111 < uVar15)) goto LAB_005d2c2d;
  } while( true );
}

Assistant:

static int MY_FAST_CALL LzmaDec_DecodeReal2(CLzmaDec *p, SizeT limit, const Byte *bufLimit)
{
  do
  {
    SizeT limit2 = limit;
    if (p->checkDicSize == 0)
    {
      UInt32 rem = p->prop.dicSize - p->processedPos;
      if (limit - p->dicPos > rem)
        limit2 = p->dicPos + rem;
    }
    
    RINOK(LzmaDec_DecodeReal(p, limit2, bufLimit));
    
    if (p->checkDicSize == 0 && p->processedPos >= p->prop.dicSize)
      p->checkDicSize = p->prop.dicSize;
    
    LzmaDec_WriteRem(p, limit);
  }
  while (p->dicPos < limit && p->buf < bufLimit && p->remainLen < kMatchSpecLenStart);

  if (p->remainLen > kMatchSpecLenStart)
    p->remainLen = kMatchSpecLenStart;

  return 0;
}